

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upstream_ip_hash_module.c
# Opt level: O1

ngx_int_t ngx_http_upstream_get_ip_hash_peer(ngx_peer_connection_t *pc,void *data)

{
  ulong *puVar1;
  long lVar2;
  byte bVar3;
  long lVar4;
  ngx_int_t nVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 *puVar8;
  ulong uVar9;
  
  if ((pc->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,pc->log,0,"get ip hash peer, try: %ui");
  }
  if (*(long *)(*(long *)((long)data + 8) + 8) != 0) {
    ngx_rwlock_wlock((ngx_atomic_t *)(*(long *)((long)data + 8) + 0x10));
  }
  if ((*(byte *)((long)data + 0x40) < 0x15) &&
     ((*(byte *)(*(long *)((long)data + 8) + 0x28) & 1) == 0)) {
    lVar2 = ngx_cached_time->sec;
    pc->field_0x68 = pc->field_0x68 & 0xfe;
    pc->connection = (ngx_connection_t *)0x0;
    uVar9 = *(ulong *)((long)data + 0x28);
    do {
      if ((ulong)*(byte *)((long)data + 0x30) != 0) {
        uVar6 = 0;
        do {
          uVar9 = ((ulong)*(byte *)(*(long *)((long)data + 0x38) + uVar6) + uVar9 * 0x71) % 0x187f;
          uVar6 = uVar6 + 1;
        } while (*(byte *)((long)data + 0x30) != uVar6);
      }
      uVar6 = uVar9 % *(ulong *)(*(long *)((long)data + 8) + 0x20);
      puVar8 = *(undefined8 **)(*(long *)((long)data + 8) + 0x40);
      uVar7 = 0;
      lVar4 = puVar8[8];
      while (lVar4 <= (long)uVar6) {
        uVar6 = uVar6 - lVar4;
        uVar7 = uVar7 + 1;
        puVar8 = (undefined8 *)puVar8[0x14];
        lVar4 = puVar8[8];
      }
      uVar6 = 1L << ((byte)uVar7 & 0x3f);
      if ((*(ulong *)(*(long *)((long)data + 0x18) + (uVar7 >> 6) * 8) >> (uVar7 & 0x3f) & 1) == 0)
      {
        if ((pc->log->log_level & 0x100) != 0) {
          ngx_log_error_core(8,pc->log,0,"get ip hash peer, hash: %ui %04XL",uVar7,uVar6);
        }
        if (((puVar8[0x12] == 0) &&
            (((puVar8[0xe] == 0 || ((ulong)puVar8[0xb] < (ulong)puVar8[0xe])) ||
             ((long)puVar8[0xf] < lVar2 - puVar8[0xd])))) &&
           ((puVar8[10] == 0 || ((ulong)puVar8[9] < (ulong)puVar8[10])))) {
          *(undefined8 **)((long)data + 0x10) = puVar8;
          pc->sockaddr = (sockaddr *)*puVar8;
          pc->socklen = *(socklen_t *)(puVar8 + 1);
          pc->name = (ngx_str_t *)(puVar8 + 2);
          puVar8[9] = puVar8[9] + 1;
          if ((long)puVar8[0xf] < lVar2 - puVar8[0xd]) {
            puVar8[0xd] = lVar2;
          }
          if (*(long *)(*(long *)((long)data + 8) + 8) != 0) {
            ngx_rwlock_unlock((ngx_atomic_t *)(*(long *)((long)data + 8) + 0x10));
          }
          puVar1 = (ulong *)(*(long *)((long)data + 0x18) + (uVar7 >> 6) * 8);
          *puVar1 = *puVar1 | uVar6;
          *(ulong *)((long)data + 0x28) = uVar9;
          return 0;
        }
      }
      bVar3 = *(char *)((long)data + 0x40) + 1;
      *(byte *)((long)data + 0x40) = bVar3;
    } while (bVar3 < 0x15);
  }
  if (*(long *)(*(long *)((long)data + 8) + 8) != 0) {
    ngx_rwlock_unlock((ngx_atomic_t *)(*(long *)((long)data + 8) + 0x10));
  }
  nVar5 = (**(code **)((long)data + 0x48))(pc,data);
  return nVar5;
}

Assistant:

static ngx_int_t
ngx_http_upstream_get_ip_hash_peer(ngx_peer_connection_t *pc, void *data)
{
    ngx_http_upstream_ip_hash_peer_data_t  *iphp = data;

    time_t                        now;
    ngx_int_t                     w;
    uintptr_t                     m;
    ngx_uint_t                    i, n, p, hash;
    ngx_http_upstream_rr_peer_t  *peer;

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, pc->log, 0,
                   "get ip hash peer, try: %ui", pc->tries);

    /* TODO: cached */

    ngx_http_upstream_rr_peers_wlock(iphp->rrp.peers);

    if (iphp->tries > 20 || iphp->rrp.peers->single) {
        ngx_http_upstream_rr_peers_unlock(iphp->rrp.peers);
        return iphp->get_rr_peer(pc, &iphp->rrp);
    }

    now = ngx_time();

    pc->cached = 0;
    pc->connection = NULL;

    hash = iphp->hash;

    for ( ;; ) {

        for (i = 0; i < (ngx_uint_t) iphp->addrlen; i++) {
            hash = (hash * 113 + iphp->addr[i]) % 6271;
        }

        w = hash % iphp->rrp.peers->total_weight;
        peer = iphp->rrp.peers->peer;
        p = 0;

        while (w >= peer->weight) {
            w -= peer->weight;
            peer = peer->next;
            p++;
        }

        n = p / (8 * sizeof(uintptr_t));
        m = (uintptr_t) 1 << p % (8 * sizeof(uintptr_t));

        if (iphp->rrp.tried[n] & m) {
            goto next;
        }

        ngx_log_debug2(NGX_LOG_DEBUG_HTTP, pc->log, 0,
                       "get ip hash peer, hash: %ui %04XL", p, (uint64_t) m);

        if (peer->down) {
            goto next;
        }

        if (peer->max_fails
            && peer->fails >= peer->max_fails
            && now - peer->checked <= peer->fail_timeout)
        {
            goto next;
        }

        if (peer->max_conns && peer->conns >= peer->max_conns) {
            goto next;
        }

        break;

    next:

        if (++iphp->tries > 20) {
            ngx_http_upstream_rr_peers_unlock(iphp->rrp.peers);
            return iphp->get_rr_peer(pc, &iphp->rrp);
        }
    }

    iphp->rrp.current = peer;

    pc->sockaddr = peer->sockaddr;
    pc->socklen = peer->socklen;
    pc->name = &peer->name;

    peer->conns++;

    if (now - peer->checked > peer->fail_timeout) {
        peer->checked = now;
    }

    ngx_http_upstream_rr_peers_unlock(iphp->rrp.peers);

    iphp->rrp.tried[n] |= m;
    iphp->hash = hash;

    return NGX_OK;
}